

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Vector<float,_4>_>::doExecute
          (VariableStatement<tcu::Vector<float,_4>_> *this,EvalContext *ctx)

{
  Environment *pEVar1;
  Variable<tcu::Vector<float,_4>_> *pVVar2;
  Expr<tcu::Vector<float,_4>_> *pEVar3;
  IVal *__dest;
  IVal local_d8;
  IVal local_78;
  EvalContext *local_18;
  EvalContext *ctx_local;
  VariableStatement<tcu::Vector<float,_4>_> *this_local;
  
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pEVar3 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>::operator->
                       ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_> *)
                        &this->m_value);
    Expr<tcu::Vector<float,_4>_>::evaluate(&local_d8,pEVar3,local_18);
    pEVar1 = local_18->env;
    pVVar2 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                       (&(this->m_variable).
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                       );
    __dest = Environment::lookup<tcu::Vector<float,4>>(pEVar1,pVVar2);
    memcpy(__dest,&local_d8,0x60);
  }
  else {
    pEVar1 = ctx->env;
    pVVar2 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::operator*
                       (&(this->m_variable).
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                       );
    pEVar3 = de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>::operator->
                       ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_> *)
                        &this->m_value);
    Expr<tcu::Vector<float,_4>_>::evaluate(&local_78,pEVar3,local_18);
    Environment::bind<tcu::Vector<float,4>>(pEVar1,pVVar2,&local_78);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}